

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> * __thiscall
TPZAutoPointer<TPZFunction<std::complex<long_double>_>_>::operator=
          (TPZAutoPointer<TPZFunction<std::complex<long_double>_>_> *this,
          TPZFunction<std::complex<long_double>_> *rval)

{
  bool bVar1;
  TPZReference *this_00;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      Release(this);
    }
  }
  this_00 = (TPZReference *)operator_new(0x10);
  TPZReference::TPZReference(this_00,rval);
  this->fRef = this_00;
  return this;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }